

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

size_t vkt::api::anon_unknown_1::getCurrentSystemMemoryUsage
                 (AllocationCallbackRecorder *allocRecoder)

{
  bool bVar1;
  deBool dVar2;
  TestError *this;
  size_t sVar3;
  size_type sVar4;
  undefined1 local_70 [8];
  AllocationCallbackValidationResults validationResults;
  size_t systemAllocationOverhead;
  AllocationCallbackRecorder *allocRecoder_local;
  
  validationResults.violations.
  super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x10;
  ::vk::AllocationCallbackValidationResults::AllocationCallbackValidationResults
            ((AllocationCallbackValidationResults *)local_70);
  ::vk::validateAllocationCallbacks(allocRecoder,(AllocationCallbackValidationResults *)local_70);
  while( true ) {
    dVar2 = ::deGetFalse();
    if (dVar2 != 0) break;
    bVar1 = std::
            vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
            ::empty((vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                     *)(validationResults.internalAllocationTotal[0] + 4));
    if (!bVar1) break;
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      sVar3 = ::vk::getLiveSystemAllocationTotal((AllocationCallbackValidationResults *)local_70);
      sVar4 = std::
              vector<vk::AllocationCallbackRecord,_std::allocator<vk::AllocationCallbackRecord>_>::
              size((vector<vk::AllocationCallbackRecord,_std::allocator<vk::AllocationCallbackRecord>_>
                    *)local_70);
      ::vk::AllocationCallbackValidationResults::~AllocationCallbackValidationResults
                ((AllocationCallbackValidationResults *)local_70);
      return sVar3 + sVar4 * 0x10;
    }
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,(char *)0x0,"validationResults.violations.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiObjectManagementTests.cpp"
             ,0x14b);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

size_t getCurrentSystemMemoryUsage (const AllocationCallbackRecorder& allocRecoder)
{
	const size_t						systemAllocationOverhead	= sizeof(void*)*2;
	AllocationCallbackValidationResults	validationResults;

	validateAllocationCallbacks(allocRecoder, &validationResults);
	TCU_CHECK(validationResults.violations.empty());

	return getLiveSystemAllocationTotal(validationResults) + systemAllocationOverhead*validationResults.liveAllocations.size();
}